

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  ScriptModuleType SVar1;
  WastParseOptions *pWVar2;
  pointer data;
  char *pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  Command *pCVar6;
  pointer pEVar7;
  Result RVar8;
  TextScriptModule *pTVar9;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar10;
  Module *out_module;
  pointer pEVar11;
  Command *pCVar12;
  Index IVar13;
  long lVar14;
  allocator local_c2;
  allocator local_c1;
  Command *local_c0;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_b8;
  Module *local_b0;
  Command *local_a8;
  CommandPtr *local_a0;
  Errors errors;
  ReadBinaryOptions local_78;
  Index local_58 [8];
  undefined1 local_38 [8];
  
  local_b8._M_head_impl = (ScriptModule *)0x0;
  RVar8 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                  *)&local_b8);
  if (RVar8.enum_ == Error) {
    RVar8.enum_ = Error;
  }
  else {
    MakeUnique<wabt::ModuleCommand>();
    pCVar12 = local_c0;
    SVar1 = (local_b8._M_head_impl)->type_;
    if (SVar1 == Quoted) {
      std::__cxx11::string::string((string *)&local_78,"a binary module",&local_c1);
      std::__cxx11::string::string((string *)local_58,"a text module",&local_c2);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errors,
                 (string *)&local_78,local_38);
      RVar8 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&errors,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&errors);
      lVar14 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        lVar14 = lVar14 + -0x20;
      } while (lVar14 != -0x20);
    }
    else {
      out_module = (Module *)(local_c0 + 1);
      if (SVar1 == Binary) {
        local_a0 = out_command;
        pDVar10 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>
                            (local_b8._M_head_impl);
        local_78.log_stream = (Stream *)0x0;
        local_78._24_3_ = 0x10100;
        pWVar2 = this->options_;
        local_78.features.bulk_memory_enabled_ = (pWVar2->features).bulk_memory_enabled_;
        local_78.features.reference_types_enabled_ = (pWVar2->features).reference_types_enabled_;
        local_78.features.annotations_enabled_ = (pWVar2->features).annotations_enabled_;
        local_78.features.gc_enabled_ = (pWVar2->features).gc_enabled_;
        local_78.features._0_8_ = *(undefined8 *)&pWVar2->features;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data = (pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
        ReadBinaryIr("<text>",data,
                     (long)(pDVar10->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)data,&local_78,&errors,
                     out_module);
        local_a8 = pCVar12;
        std::__cxx11::string::_M_assign((string *)(pCVar12 + 3));
        pEVar7 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar3 = (pDVar10->loc).filename.data_;
        sVar4 = (pDVar10->loc).filename.size_;
        uVar5 = *(undefined8 *)((long)&(pDVar10->loc).field_1 + 8);
        pCVar12[2]._vptr_Command = (_func_int **)(pDVar10->loc).field_1.field_1.offset;
        *(undefined8 *)&pCVar12[2].type = uVar5;
        (out_module->loc).filename.data_ = pcVar3;
        *(size_type *)&pCVar12[1].type = sVar4;
        local_b0 = out_module;
        for (pEVar11 = errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                       super__Vector_impl_data._M_start; pEVar11 != pEVar7; pEVar11 = pEVar11 + 1) {
          if (pEVar11->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                          ,0xb03,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar11->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x1aa022,(pEVar11->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x1aa03d);
          }
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
        out_module = local_b0;
        out_command = local_a0;
        pCVar12 = local_a8;
      }
      else if (SVar1 == Text) {
        pTVar9 = cast<wabt::TextScriptModule,wabt::ScriptModule>(local_b8._M_head_impl);
        Module::operator=(out_module,&pTVar9->module);
      }
      if (script != (Script *)0x0) {
        IVar13 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (*(long *)&pCVar12[3].type != 0) {
          local_78.features._0_8_ = (out_module->loc).filename.data_;
          local_78.features._8_4_ = *(undefined4 *)&(out_module->loc).filename.size_;
          local_78._12_4_ = *(undefined4 *)((long)&(out_module->loc).filename.size_ + 4);
          local_78.log_stream = (Stream *)(out_module->loc).field_1.field_1.offset;
          local_78._24_4_ = (out_module->loc).field_1.field_0.last_column;
          local_78._28_4_ = *(undefined4 *)((long)&(out_module->loc).field_1 + 0xc);
          local_58[0] = IVar13;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,pCVar12 + 3);
        }
        this->last_module_index_ = IVar13;
      }
      pCVar6 = local_c0;
      local_c0 = (Command *)0x0;
      pCVar12 = (out_command->_M_t).
                super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar6;
      if (pCVar12 == (Command *)0x0) {
        RVar8.enum_ = Ok;
        goto LAB_00175c24;
      }
      (*pCVar12->_vptr_Command[1])();
      RVar8.enum_ = Ok;
    }
    if (local_c0 != (Command *)0x0) {
      (*local_c0->_vptr_Command[1])();
    }
  }
LAB_00175c24:
  if (local_b8._M_head_impl != (ScriptModule *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar8.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}